

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

BoolExpr * BO_and(List *ls)

{
  BoolExprStruct **ppBVar1;
  BoolExprStruct *pBVar2;
  bool bVar3;
  BoolExpr *pBVar4;
  BoolExpr *pBVar5;
  ListStruct *ls_00;
  
  pBVar4 = (BoolExpr *)malloc(0x18);
  pBVar4->type = E_AND;
  ppBVar1 = &pBVar4->subexpr;
  pBVar4->subexpr = (BoolExprStruct *)0x0;
  pBVar4->next = (BoolExprStruct *)0x0;
  ls_00 = ls->cdr;
  if (ls_00 == (ListStruct *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
    do {
      pBVar5 = make_boolean_expr(ls_00);
      if (pBVar5->type == E_TRUE) {
        bVar3 = true;
      }
      else {
        if (pBVar5->type == E_FALSE) goto LAB_00108c5f;
        pBVar5->next = *ppBVar1;
        *ppBVar1 = pBVar5;
      }
      ls_00 = ls_00->cdr;
    } while (ls_00 != (ListStruct *)0x0);
    bVar3 = !bVar3;
  }
  pBVar2 = *ppBVar1;
  if (pBVar2 == (BoolExprStruct *)0x0) {
    if (bVar3) {
      parse_error((List *)0x0,"and takes arguments!\n");
LAB_00108c5f:
      pBVar4 = &false_bool_expr;
    }
    else {
      pBVar4 = &true_bool_expr;
    }
  }
  else if (pBVar2->next == (BoolExprStruct *)0x0) {
    pBVar4 = pBVar2;
  }
  return pBVar4;
}

Assistant:

static BoolExpr *
BO_and(const List *ls)
{
  BoolExpr *subexpr, *ret;
  BOOL hit_true = FALSE;

  ret = create_bool_expr (E_AND, NULL);
  while ((ls = ls->cdr))
    {
      subexpr = make_boolean_expr (ls);
      if (subexpr->type == E_FALSE)  /* If we ever hit FALSE, expr is FALSE */
	return &false_bool_expr;
      if (subexpr->type != E_TRUE)   /* No sense adding in TRUE statements */
	{
	  subexpr->next = ret->subexpr;
	  ret->subexpr = subexpr;
	}
      else hit_true = TRUE;
    }
  if (ret->subexpr == NULL)
    {
      if (hit_true)   /* If we hit nothing but TRUE's return TRUE */
	return &true_bool_expr;
      parse_error(ls, "and takes arguments!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  
  if (ret->subexpr->next == NULL) /* (and a) == a */
    return ret->subexpr;   
  
  return ret;
}